

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeSignedInteger(Parser *this,int *output,ErrorMaker error)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string_view text;
  uint64_t local_30;
  
  text._M_str = "-";
  text._M_len = 1;
  bVar1 = TryConsume(this,text);
  local_30 = 0;
  bVar2 = ConsumeInteger64(this,(ulong)bVar1 + 0x7fffffff,&local_30,error);
  if (bVar2) {
    iVar3 = -(int)local_30;
    if (!bVar1) {
      iVar3 = (int)local_30;
    }
    *output = iVar3;
  }
  return bVar2;
}

Assistant:

bool Parser::ConsumeSignedInteger(int* output, ErrorMaker error) {
  bool is_negative = false;
  uint64_t max_value = std::numeric_limits<int32_t>::max();
  if (TryConsume("-")) {
    is_negative = true;
    max_value += 1;
  }
  uint64_t value = 0;
  DO(ConsumeInteger64(max_value, &value, error));
  if (is_negative) value *= -1;
  *output = value;
  return true;
}